

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

bool __thiscall Json::Value::isUInt(Value *this)

{
  double d;
  char cVar1;
  bool bVar2;
  
  cVar1 = this->field_0x8;
  if (cVar1 == '\x03') {
    d = (this->value_).real_;
    bVar2 = false;
    if ((0.0 <= d) && (d <= 4294967295.0)) {
      bVar2 = IsIntegral(d);
      return bVar2;
    }
  }
  else {
    if ((cVar1 != '\x02') && (cVar1 != '\x01')) {
      return false;
    }
    bVar2 = *(int *)((long)&this->value_ + 4) == 0;
  }
  return bVar2;
}

Assistant:

bool Value::isUInt() const {
  switch (type_) {
  case intValue:
    return value_.int_ >= 0 && LargestUInt(value_.int_) <= LargestUInt(maxUInt);
  case uintValue:
    return value_.uint_ <= maxUInt;
  case realValue:
    return value_.real_ >= 0 && value_.real_ <= maxUInt &&
           IsIntegral(value_.real_);
  default:
    break;
  }
  return false;
}